

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::ResolveLanguageCompiler
          (cmGlobalGenerator *this,string *lang,cmMakefile *mf,bool optional)

{
  pointer pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmState *pcVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  string *psVar7;
  _Alloc_hider _Var8;
  string path;
  string langComp;
  string cnameString;
  string pathString;
  string changeVars;
  string local_f8;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_98 [40];
  string local_70;
  string local_50;
  
  local_b8._M_allocated_capacity = (size_type)&local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_","");
  std::__cxx11::string::_M_append(local_b8._M_local_buf,(ulong)(lang->_M_dataplus)._M_p);
  std::__cxx11::string::append(local_b8._M_local_buf);
  pcVar6 = cmMakefile::GetDefinition(mf,(string *)&local_b8);
  if (pcVar6 == (char *)0x0) {
    if (optional) goto LAB_002dd9e3;
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_b8._M_allocated_capacity,
               local_b8._8_8_ + local_b8._M_allocated_capacity);
    std::__cxx11::string::append((char *)&local_f8);
    cmSystemTools::Error(&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_002dd9e3;
  }
  else {
    psVar7 = cmMakefile::GetRequiredDefinition(mf,(string *)&local_b8);
    local_f8._M_string_length = 0;
    local_f8.field_2._M_local_buf[0] = '\0';
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    bVar4 = cmsys::SystemTools::FileIsFullPath(psVar7);
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)&local_f8);
    }
    else {
      local_98._0_8_ = (pointer)0x0;
      local_98._8_8_ = (pointer)0x0;
      local_98._16_8_ = (pointer)0x0;
      cmsys::SystemTools::FindProgram
                (&local_50,psVar7,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_98,false);
      std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
    }
    if ((optional) ||
       ((local_f8._M_string_length != 0 &&
        (bVar4 = cmsys::SystemTools::FileExists(&local_f8), bVar4)))) {
      psVar7 = cmState::GetInitializedCacheValue(this->CMakeInstance->State,(string *)&local_b8);
      paVar2 = &local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)paVar2;
      if (psVar7 != (string *)0x0 && !optional) {
        local_98._0_8_ = local_98 + 0x10;
        local_98._8_8_ = (pointer)0x0;
        local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
        bVar4 = cmsys::SystemTools::FileIsFullPath(psVar7);
        if (bVar4) {
          std::__cxx11::string::_M_assign((string *)local_98);
        }
        else {
          local_d8._0_8_ = (pointer)0x0;
          local_d8._8_8_ = (pointer)0x0;
          local_d8._16_8_ = (pointer)0x0;
          cmsys::SystemTools::FindProgram
                    (&local_70,psVar7,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_d8,false);
          std::__cxx11::string::operator=((string *)local_98,(string *)&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d8);
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_f8._M_dataplus._M_p,
                   local_f8._M_dataplus._M_p + local_f8._M_string_length);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_98);
        cmsys::SystemTools::ConvertToUnixSlashes(&local_70);
        _Var8._M_p = local_70._M_dataplus._M_p;
        if ((local_98._8_8_ != local_70._M_string_length) ||
           (((pointer)local_98._8_8_ != (pointer)0x0 &&
            (iVar5 = bcmp((void *)local_98._0_8_,local_70._M_dataplus._M_p,local_98._8_8_),
            iVar5 != 0)))) {
          pcVar3 = this->CMakeInstance->State;
          pbVar1 = (pointer)(local_d8 + 0x10);
          local_d8._0_8_ = pbVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_","");
          pcVar6 = cmState::GetGlobalProperty(pcVar3,(string *)local_d8);
          if ((pointer)local_d8._0_8_ != pbVar1) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
          if (pcVar6 != (char *)0x0) {
            std::__cxx11::string::append((char *)&local_50);
            std::__cxx11::string::append((char *)&local_50);
          }
          std::__cxx11::string::_M_append((char *)&local_50,local_b8._M_allocated_capacity);
          std::__cxx11::string::append((char *)&local_50);
          std::__cxx11::string::_M_append((char *)&local_50,(ulong)(psVar7->_M_dataplus)._M_p);
          pcVar3 = this->CMakeInstance->State;
          local_d8._0_8_ = pbVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_","");
          cmState::SetGlobalProperty(pcVar3,(string *)local_d8,local_50._M_dataplus._M_p);
          _Var8._M_p = local_70._M_dataplus._M_p;
          if ((pointer)local_d8._0_8_ != pbVar1) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
            _Var8._M_p = local_70._M_dataplus._M_p;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var8._M_p != &local_70.field_2) {
          operator_delete(_Var8._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar2) {
          operator_delete(local_50._M_dataplus._M_p,
                          CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                   local_50.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_002dd9e3;
  }
  operator_delete(local_f8._M_dataplus._M_p,
                  CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                           local_f8.field_2._M_local_buf[0]) + 1);
LAB_002dd9e3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_allocated_capacity != &local_a8) {
    operator_delete((void *)local_b8._M_allocated_capacity,local_a8._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::ResolveLanguageCompiler(const std::string& lang,
                                                cmMakefile* mf,
                                                bool optional) const
{
  std::string langComp = "CMAKE_";
  langComp += lang;
  langComp += "_COMPILER";

  if (!mf->GetDefinition(langComp)) {
    if (!optional) {
      cmSystemTools::Error(langComp + " not set, after EnableLanguage");
    }
    return;
  }
  std::string const& name = mf->GetRequiredDefinition(langComp);
  std::string path;
  if (!cmSystemTools::FileIsFullPath(name)) {
    path = cmSystemTools::FindProgram(name);
  } else {
    path = name;
  }
  if (!optional && (path.empty() || !cmSystemTools::FileExists(path))) {
    return;
  }
  const std::string* cname =
    this->GetCMakeInstance()->GetState()->GetInitializedCacheValue(langComp);
  std::string changeVars;
  if (cname && !optional) {
    std::string cnameString;
    if (!cmSystemTools::FileIsFullPath(*cname)) {
      cnameString = cmSystemTools::FindProgram(*cname);
    } else {
      cnameString = *cname;
    }
    std::string pathString = path;
    // get rid of potentially multiple slashes:
    cmSystemTools::ConvertToUnixSlashes(cnameString);
    cmSystemTools::ConvertToUnixSlashes(pathString);
    if (cnameString != pathString) {
      const char* cvars =
        this->GetCMakeInstance()->GetState()->GetGlobalProperty(
          "__CMAKE_DELETE_CACHE_CHANGE_VARS_");
      if (cvars) {
        changeVars += cvars;
        changeVars += ";";
      }
      changeVars += langComp;
      changeVars += ";";
      changeVars += *cname;
      this->GetCMakeInstance()->GetState()->SetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_", changeVars.c_str());
    }
  }
}